

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recovery_test.cc
# Opt level: O0

Status __thiscall leveldb::RecoveryTest::OpenWithStatus(RecoveryTest *this,Options *options)

{
  FilterPolicy *in_RDX;
  undefined1 local_80 [8];
  Options opts;
  Options *options_local;
  RecoveryTest *this_local;
  
  opts.filter_policy = in_RDX;
  Close((RecoveryTest *)options);
  Options::Options((Options *)local_80);
  if (opts.filter_policy == (FilterPolicy *)0x0) {
    opts.max_file_size._4_1_ = 1;
    opts.comparator._0_1_ = 1;
  }
  else {
    memcpy(local_80,opts.filter_policy,0x60);
  }
  if (opts._8_8_ == 0) {
    opts._8_8_ = options->block_cache;
  }
  DB::Open((DB *)this,(Options *)local_80,(string *)&options->env,(DB **)&options->block_size);
  return (Status)(char *)this;
}

Assistant:

Status OpenWithStatus(Options* options = nullptr) {
    Close();
    Options opts;
    if (options != nullptr) {
      opts = *options;
    } else {
      opts.reuse_logs = true;  // TODO(sanjay): test both ways
      opts.create_if_missing = true;
    }
    if (opts.env == nullptr) {
      opts.env = env_;
    }
    return DB::Open(opts, dbname_, &db_);
  }